

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

void satoko_write_dimacs(satoko_t *s,char *fname,int wrt_lrnt,int zero_var)

{
  char cVar1;
  uint uVar2;
  vec_uint_t *pvVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  FILE *__stream;
  vec_char_t *pvVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  char *__format;
  int iVar12;
  ulong uVar13;
  
  if (1 < (uint)wrt_lrnt) {
    __assert_fail("wrt_lrnt == 0 || wrt_lrnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x250,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  if (1 < (uint)zero_var) {
    __assert_fail("zero_var == 0 || zero_var == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x251,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  uVar9 = s->activity->size;
  uVar8 = s->trail->size;
  uVar2 = s->originals->size;
  uVar5 = s->learnts->size;
  uVar6 = (ulong)uVar5;
  __stream = _stdout;
  if (fname != (char *)0x0) {
    __stream = fopen(fname,"w");
  }
  if (__stream == (FILE *)0x0) {
    puts("Error: Cannot open output file.");
    return;
  }
  if (wrt_lrnt == 0) {
    uVar5 = 0;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)uVar9,(ulong)(uVar8 + uVar2 + uVar5));
  pvVar7 = s->assigns;
  if (pvVar7->size != 0) {
    uVar13 = 0;
    uVar10 = 0;
    do {
      cVar1 = pvVar7->data[uVar10];
      iVar12 = (int)uVar13;
      if (cVar1 != '\x03') {
        if (zero_var == 0) {
          if (cVar1 == '\x01') {
            uVar9 = iVar12 - 1;
          }
          else {
            uVar9 = (int)uVar10 + 1;
          }
          uVar13 = (ulong)uVar9;
          __format = "%d 0\n";
        }
        else {
          if (cVar1 != '\x01') {
            uVar13 = uVar10 & 0xffffffff;
          }
          __format = "%d\n";
        }
        fprintf(__stream,__format,uVar13);
      }
      uVar10 = uVar10 + 1;
      pvVar7 = s->assigns;
      uVar13 = (ulong)(iVar12 - 1);
    } while (uVar10 < pvVar7->size);
  }
  pvVar3 = s->originals;
  if (pvVar3 == (vec_uint_t *)0x0) {
LAB_0055fd96:
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                  ,0x9a,"unsigned int *vec_uint_data(vec_uint_t *)");
  }
  if (pvVar3->size != 0) {
    puVar4 = pvVar3->data;
    uVar13 = 0;
    do {
      if ((ulong)puVar4[uVar13] == 0xffffffff) {
        puVar11 = (uint *)0x0;
      }
      else {
        puVar11 = s->all_clauses->data + puVar4[uVar13];
      }
      if (puVar11[1] != 0) {
        uVar10 = 0;
        do {
          uVar8 = (puVar11[uVar10 + 2] >> 1) + (zero_var ^ 1U);
          uVar9 = -uVar8;
          if ((puVar11[uVar10 + 2] & 1) == 0) {
            uVar9 = uVar8;
          }
          fprintf(__stream,"%d ",(ulong)uVar9);
          uVar10 = uVar10 + 1;
        } while (uVar10 < puVar11[1]);
      }
      if (zero_var == 1) {
        fputc(10,__stream);
      }
      else {
        fwrite("0\n",2,1,__stream);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < s->originals->size);
  }
  if (wrt_lrnt != 0) {
    if (s->learnts == (vec_uint_t *)0x0) goto LAB_0055fd96;
    if (uVar6 != 0) {
      puVar4 = s->learnts->data;
      uVar13 = 0;
      do {
        uVar10 = (ulong)puVar4[uVar13];
        if (uVar10 == 0xffffffff) {
          puVar11 = (uint *)0x0;
        }
        else {
          puVar11 = s->all_clauses->data + uVar10;
        }
        if (puVar11[1] != 0) {
          uVar10 = 0;
          do {
            uVar8 = (puVar11[uVar10 + 2] >> 1) + (zero_var ^ 1U);
            uVar9 = -uVar8;
            if ((puVar11[uVar10 + 2] & 1) == 0) {
              uVar9 = uVar8;
            }
            fprintf(__stream,"%d ",(ulong)uVar9);
            uVar10 = uVar10 + 1;
          } while (uVar10 < puVar11[1]);
        }
        if (zero_var == 1) {
          fputc(10,__stream);
        }
        else {
          fwrite("0\n",2,1,__stream);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar6);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void satoko_write_dimacs(satoko_t *s, char *fname, int wrt_lrnt, int zero_var)
{
    FILE *file;
    unsigned i;
    unsigned n_vars = vec_act_size(s->activity);
    unsigned n_orig = vec_uint_size(s->originals) + vec_uint_size(s->trail);
    unsigned n_lrnts = vec_uint_size(s->learnts);
    unsigned *array;

    assert(wrt_lrnt == 0 || wrt_lrnt == 1);
    assert(zero_var == 0 || zero_var == 1);
    if (fname != NULL)
        file = fopen(fname, "w");
    else
        file = stdout;
    
    if (file == NULL) {
        printf( "Error: Cannot open output file.\n");
        return;
    }
    fprintf(file, "p cnf %d %d\n", n_vars, wrt_lrnt ? n_orig + n_lrnts : n_orig);
    for (i = 0; i < vec_char_size(s->assigns); i++) {
        if ( var_value(s, i) != SATOKO_VAR_UNASSING ) {
            if (zero_var)
                fprintf(file, "%d\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i) : i);
            else
                fprintf(file, "%d 0\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i + 1) : i + 1);
        }
    }
    array = vec_uint_data(s->originals);
    for (i = 0; i < vec_uint_size(s->originals); i++)
        clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    
    if (wrt_lrnt) {
        array = vec_uint_data(s->learnts);
        for (i = 0; i < n_lrnts; i++)
            clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    }
    fclose(file);

}